

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test_util.h
# Opt level: O0

CleanupGrowthInfo * __thiscall
google::protobuf::internal::
CleanupGrowth<google::protobuf::(anonymous_namespace)::RepeatedField_Cleanups_Test::TestBody()::__0>
          (CleanupGrowthInfo *__return_storage_ptr__,internal *this,Arena *arena,
          anon_class_8_1_a7a63227 f)

{
  bool bVar1;
  iterator first;
  iterator last;
  reference ppvVar2;
  void *local_a8;
  void *p;
  iterator __end3;
  iterator __begin3;
  vector<void_*,_std::allocator<void_*>_> *__range3;
  undefined1 local_70 [8];
  vector<void_*,_std::allocator<void_*>_> new_cleanups;
  uint64_t new_space_used;
  undefined1 local_40 [8];
  vector<void_*,_std::allocator<void_*>_> old_cleanups;
  uint64_t old_space_used;
  Arena *arena_local;
  anon_class_8_1_a7a63227 f_local;
  CleanupGrowthInfo *res;
  
  arena_local = arena;
  f_local.arena = (Arena *)__return_storage_ptr__;
  old_cleanups.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Arena::SpaceUsed((Arena *)this);
  ArenaTestPeer::PeekCleanupListForTesting
            ((vector<void_*,_std::allocator<void_*>_> *)local_40,(Arena *)this);
  protobuf::anon_unknown_0::RepeatedField_Cleanups_Test::TestBody::anon_class_8_1_a7a63227::
  operator()((anon_class_8_1_a7a63227 *)&arena_local);
  new_cleanups.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Arena::SpaceUsed((Arena *)this);
  ArenaTestPeer::PeekCleanupListForTesting
            ((vector<void_*,_std::allocator<void_*>_> *)local_70,(Arena *)this);
  CleanupGrowthInfo::CleanupGrowthInfo(__return_storage_ptr__);
  __return_storage_ptr__->space_used =
       (long)new_cleanups.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage -
       (long)old_cleanups.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  first = std::vector<void_*,_std::allocator<void_*>_>::begin
                    ((vector<void_*,_std::allocator<void_*>_> *)local_70);
  last = std::vector<void_*,_std::allocator<void_*>_>::end
                   ((vector<void_*,_std::allocator<void_*>_> *)local_70);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void*>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<void*>>
  ::insert<__gnu_cxx::__normal_iterator<void**,std::vector<void*,std::allocator<void*>>>>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void*>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<void*>>
              *)&__return_storage_ptr__->cleanups,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             first._M_current,
             (__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>)
             last._M_current);
  __end3 = std::vector<void_*,_std::allocator<void_*>_>::begin
                     ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  p = (void *)std::vector<void_*,_std::allocator<void_*>_>::end
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>
                                     *)&p), bVar1) {
    ppvVar2 = __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::
              operator*(&__end3);
    local_a8 = *ppvVar2;
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void*>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<void*>>
    ::erase<void*>((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void*>,absl::lts_20250127::container_internal::HashEq<void*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void*,void>::Eq,std::allocator<void*>>
                    *)&__return_storage_ptr__->cleanups,&local_a8);
    __gnu_cxx::__normal_iterator<void_**,_std::vector<void_*,_std::allocator<void_*>_>_>::operator++
              (&__end3);
  }
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_70);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

CleanupGrowthInfo CleanupGrowth(Arena& arena, Func f) {
  auto old_space_used = arena.SpaceUsed();
  auto old_cleanups = ArenaTestPeer::PeekCleanupListForTesting(&arena);
  f();
  auto new_space_used = arena.SpaceUsed();
  auto new_cleanups = ArenaTestPeer::PeekCleanupListForTesting(&arena);
  CleanupGrowthInfo res;
  res.space_used = new_space_used - old_space_used;
  res.cleanups.insert(new_cleanups.begin(), new_cleanups.end());
  for (auto p : old_cleanups) res.cleanups.erase(p);
  return res;
}